

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,DMatrix<double> *a)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  double *pdVar6;
  DMatrix<double> *in_RSI;
  istream *in_RDI;
  int i;
  int k;
  int cols;
  int rows;
  char c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elem;
  double v;
  value_type *in_stack_ffffffffffffff48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff50;
  value_type vVar7;
  value_type_conflict4 *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  bool local_89;
  bool local_79;
  int local_78;
  int local_74;
  int local_70;
  char local_31;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_30;
  double local_18;
  DMatrix<double> *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1a8f54);
  std::operator>>(local_8,&local_31);
  if (local_31 == '[') {
    while( true ) {
      local_79 = false;
      if (local_31 != ']') {
        local_79 = std::ios::operator_cast_to_bool
                             ((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
      }
      if (local_79 == false) break;
      std::operator>>(local_8,&local_31);
      if (local_31 != ']') {
        if (local_31 != ';') {
          std::istream::putback((char)local_8);
        }
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)0x1a9046);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        while( true ) {
          local_89 = false;
          if ((local_31 != ';') && (local_89 = false, local_31 != ']')) {
            local_89 = std::ios::operator_cast_to_bool
                                 ((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
          }
          if (local_89 == false) break;
          std::operator>>(local_8,&local_31);
          if ((local_31 != ';') && (local_31 != ']')) {
            std::istream::putback((char)local_8);
            std::istream::operator>>(local_8,&local_18);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back(in_stack_ffffffffffffff50);
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
          }
        }
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
        if (bVar1) {
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::front(in_stack_ffffffffffffff50);
          sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::back(in_stack_ffffffffffffff50);
          sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
          if (sVar2 != sVar4) {
            std::ios::setstate((int)local_8 + (int)*(undefined8 *)(*(long *)local_8 + -0x18));
          }
        }
      }
    }
    in_stack_ffffffffffffff67 =
         std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
    if ((bool)in_stack_ffffffffffffff67) {
      sVar2 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&local_30);
      local_70 = 0;
      if (0 < (int)sVar2) {
        pvVar3 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::front(in_stack_ffffffffffffff50);
        sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
        local_70 = (int)sVar4;
      }
      DMatrix<double>::init(local_10,(EVP_PKEY_CTX *)(sVar2 & 0xffffffff));
      for (local_74 = 0; local_74 < (int)sVar2; local_74 = local_74 + 1) {
        for (local_78 = 0; local_78 < local_70; local_78 = local_78 + 1) {
          pvVar3 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_30,(long)local_74);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)local_78);
          vVar7 = *pvVar5;
          pdVar6 = DMatrix<double>::operator()(local_10,local_74,local_78);
          *pdVar6 = vVar7;
        }
      }
    }
  }
  else {
    std::ios::setstate((int)local_8 + (int)*(undefined8 *)(*(long *)local_8 + -0x18));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  return local_8;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, DMatrix<T> &a)
{
  T    v;
  std::vector<std::vector<T> > elem;
  char c;

  in >> c;

  if (c == '[')
  {
    while (c != ']' && in)
    {
      in >> c;

      if (c != ']')
      {
        if (c != ';')
        {
          in.putback(c);
        }

        elem.push_back(std::vector<T>());

        while (c != ';' && c != ']' && in)
        {
          in >> c;

          if (c != ';' && c != ']')
          {
            in.putback(c);

            in >> v;
            elem.back().push_back(v);
          }
        }

        if (in && elem.front().size() != elem.back().size())
        {
          in.setstate(std::ios_base::failbit);
        }
      }
    }

    if (in)
    {
      int rows=static_cast<int>(elem.size());
      int cols=0;

      if (rows > 0)
      {
        cols=static_cast<int>(elem.front().size());
      }

      a.init(rows, cols);

      for (int k=0; k<rows; k++)
        for (int i=0; i<cols; i++)
        {
          a(k, i)=elem[k][i];
        }
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}